

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControl::processEvent
          (QWidgetTextControl *this,QEvent *e,QPointF *coordinateOffset,QWidget *contextWidget)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  QTransform *pQVar4;
  long in_FS_OFFSET;
  QTransform t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = &DAT_00668038;
  pQVar4 = &t;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)pQVar4 = *puVar3;
    puVar3 = puVar3 + 1;
    pQVar4 = (QTransform *)((long)pQVar4 + 8);
  }
  puVar3 = &DAT_00668c68;
  pQVar4 = &t;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)pQVar4 = *puVar3;
    puVar3 = puVar3 + 1;
    pQVar4 = (QTransform *)((long)pQVar4 + 8);
  }
  t._72_2_ = 0xa800;
  QTransform::translate(coordinateOffset->xp,coordinateOffset->yp);
  (**(code **)(*(long *)this + 0x88))(this,e,&t,contextWidget);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::processEvent(QEvent *e, const QPointF &coordinateOffset, QWidget *contextWidget)
{
    QTransform t;
    t.translate(coordinateOffset.x(), coordinateOffset.y());
    processEvent(e, t, contextWidget);
}